

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O0

ComponentHandle<Tag,_entityx::EntityManager> __thiscall
entityx::EntityManager::assign<Tag,char_const(&)[4]>(EntityManager *this,Id id,char (*args) [4])

{
  EntityManager *this_00;
  char *pcVar1;
  int __c;
  int __c_00;
  char *in_RDX;
  Id in_RSI;
  EntityManager *in_RDI;
  Pool<Tag,_8192UL> *pool;
  Family family;
  ComponentHandle<Tag,_entityx::EntityManager> component;
  string *in_stack_ffffffffffffff18;
  Tag *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  BasePool *in_stack_ffffffffffffff30;
  EntityManager *in_stack_ffffffffffffff70;
  allocator local_61;
  ComponentHandle<Tag,_entityx::EntityManager> *in_stack_ffffffffffffffa0;
  Entity *in_stack_ffffffffffffffa8;
  EventManager *in_stack_ffffffffffffffb0;
  Id local_18;
  ComponentHandle<Tag,_entityx::EntityManager> local_10;
  
  local_18.id_ = in_RSI.id_;
  assert_valid(in_RDI,in_RSI);
  component_family<Tag>();
  accomodate_component<Tag>(in_stack_ffffffffffffff70);
  Entity::Id::index(&local_18,(char *)in_RSI.id_,__c);
  BasePool::get(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffa0,in_RDX,&local_61);
  pcVar1 = &stack0xffffffffffffffa0;
  Tag::Tag(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  this_00 = in_RDI + 0x48;
  pcVar1 = Entity::Id::index(&local_18,pcVar1,__c_00);
  Catch::clara::std::vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_>::operator[]
            ((vector<std::bitset<64UL>,_std::allocator<std::bitset<64UL>_>_> *)this_00,
             (ulong)pcVar1 & 0xffffffff);
  Catch::clara::std::bitset<64UL>::set
            ((bitset<64UL> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             SUB81((ulong)this_00 >> 0x38,0));
  ComponentHandle<Tag,_entityx::EntityManager>::ComponentHandle(&local_10,in_RDI,local_18);
  Entity::Entity((Entity *)&stack0xffffffffffffff70,in_RDI,local_18);
  EventManager::
  emit<entityx::ComponentAddedEvent<Tag>,entityx::Entity,entityx::ComponentHandle<Tag,entityx::EntityManager>&>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  return local_10;
}

Assistant:

ComponentHandle<C> assign(Entity::Id id, Args && ... args) {
    assert_valid(id);
    const BaseComponent::Family family = component_family<C>();
    assert(!entity_component_mask_[id.index()].test(family));

    // Placement new into the component pool.
    Pool<C> *pool = accomodate_component<C>();
    ::new(pool->get(id.index())) C(std::forward<Args>(args) ...);

    // Set the bit for this component.
    entity_component_mask_[id.index()].set(family);

    // Create and return handle.
    ComponentHandle<C> component(this, id);
    event_manager_.emit<ComponentAddedEvent<C>>(Entity(this, id), component);
    return component;
  }